

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.h
# Opt level: O0

bool __thiscall
google::protobuf::compiler::CodeGeneratorResponse_File::_internal_has_generated_code_info
          (CodeGeneratorResponse_File *this)

{
  uint32_t *puVar1;
  LogMessage *other;
  LogFinisher local_65 [20];
  byte local_51;
  LogMessage local_50;
  byte local_11;
  CodeGeneratorResponse_File *pCStack_10;
  bool value;
  CodeGeneratorResponse_File *this_local;
  
  pCStack_10 = this;
  puVar1 = internal::HasBits<1UL>::operator[](&this->_has_bits_,0);
  local_11 = (*puVar1 & 8) != 0;
  local_51 = 0;
  if (((bool)local_11) && (this->generated_code_info_ == (GeneratedCodeInfo *)0x0)) {
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/plugin.pb.h"
               ,0x677);
    local_51 = 1;
    other = internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: !value || generated_code_info_ != nullptr: ");
    internal::LogFinisher::operator=(local_65,other);
  }
  if ((local_51 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_50);
  }
  return (bool)(local_11 & 1);
}

Assistant:

inline bool CodeGeneratorResponse_File::_internal_has_generated_code_info() const {
  bool value = (_has_bits_[0] & 0x00000008u) != 0;
  PROTOBUF_ASSUME(!value || generated_code_info_ != nullptr);
  return value;
}